

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::MemPass::IsTargetType(MemPass *this,Instruction *typeInst)

{
  IRContext *this_00;
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  uint32_t id;
  uint **ppuVar6;
  MemPass *this_01;
  pointer pOVar7;
  MemPass *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  uint *local_30;
  
  this_01 = this;
  while( true ) {
    bVar3 = IsBaseTargetType(this_01,typeInst);
    if (bVar3) {
      return true;
    }
    if (typeInst->opcode_ != OpTypeArray) break;
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = (MemPass *)
              (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    id = Instruction::GetSingleWordOperand(typeInst,1);
    typeInst = analysis::DefUseManager::GetDef((DefUseManager *)this_01,id);
  }
  if (typeInst->opcode_ != OpTypeStruct) {
    return false;
  }
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:66:34)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:66:34)>
             ::_M_manager;
  pOVar7 = (typeInst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (typeInst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = pOVar7 == pOVar1;
  local_58 = this;
  if (!bVar3) {
    bVar3 = false;
    do {
      bVar4 = spvIsInIdType(pOVar7->type);
      if (bVar4) {
        ppuVar2 = (uint **)(pOVar7->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar6 = &(pOVar7->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar6 = ppuVar2;
        }
        local_30 = *ppuVar6;
        if (local_48 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar5 = (*pcStack_40)(&local_58,&local_30);
        if (cVar5 == '\0') break;
      }
      pOVar7 = pOVar7 + 1;
      bVar3 = pOVar7 == pOVar1;
    } while (!bVar3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return bVar3;
}

Assistant:

bool MemPass::IsTargetType(const Instruction* typeInst) const {
  if (IsBaseTargetType(typeInst)) return true;
  if (typeInst->opcode() == spv::Op::OpTypeArray) {
    if (!IsTargetType(
            get_def_use_mgr()->GetDef(typeInst->GetSingleWordOperand(1)))) {
      return false;
    }
    return true;
  }
  if (typeInst->opcode() != spv::Op::OpTypeStruct) return false;
  // All struct members must be math type
  return typeInst->WhileEachInId([this](const uint32_t* tid) {
    Instruction* compTypeInst = get_def_use_mgr()->GetDef(*tid);
    if (!IsTargetType(compTypeInst)) return false;
    return true;
  });
}